

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O0

int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem,uchar *pub,size_t size)

{
  int iVar1;
  uint uVar2;
  long in_RDX;
  char *in_RSI;
  secp256k1_fe y;
  secp256k1_fe x_1;
  secp256k1_fe x;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  bool bVar3;
  secp256k1_ge *in_stack_ffffffffffffff50;
  secp256k1_ge *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  secp256k1_fe *in_stack_ffffffffffffffb8;
  secp256k1_ge *in_stack_ffffffffffffffc0;
  uint local_4;
  
  if ((in_RDX == 0x21) && ((*in_RSI == '\x02' || (*in_RSI == '\x03')))) {
    iVar1 = secp256k1_fe_set_b32_limit
                      ((secp256k1_fe *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)
                       ,(uchar *)0x102004);
    bVar3 = false;
    if (iVar1 != 0) {
      iVar1 = secp256k1_ge_set_xo_var
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb4);
      bVar3 = iVar1 != 0;
    }
    local_4 = (uint)bVar3;
  }
  else if ((in_RDX == 0x41) && (((*in_RSI == '\x04' || (*in_RSI == '\x06')) || (*in_RSI == '\a'))))
  {
    iVar1 = secp256k1_fe_set_b32_limit
                      ((secp256k1_fe *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)
                       ,(uchar *)0x1020b1);
    if ((iVar1 != 0) &&
       (iVar1 = secp256k1_fe_set_b32_limit
                          ((secp256k1_fe *)
                           CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                           (uchar *)0x1020cc), iVar1 != 0)) {
      secp256k1_ge_set_xy(in_stack_ffffffffffffff50,
                          (secp256k1_fe *)
                          CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                          (secp256k1_fe *)0x1020f8);
      if (((*in_RSI == '\x06') || (*in_RSI == '\a')) &&
         (uVar2 = secp256k1_fe_is_odd((secp256k1_fe *)0x102122), uVar2 != (*in_RSI == '\a'))) {
        return 0;
      }
      iVar1 = secp256k1_ge_is_valid_var(in_stack_ffffffffffffffa8);
      return iVar1;
    }
    local_4 = 0;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem, const unsigned char *pub, size_t size) {
    if (size == 33 && (pub[0] == SECP256K1_TAG_PUBKEY_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_ODD)) {
        secp256k1_fe x;
        return secp256k1_fe_set_b32_limit(&x, pub+1) && secp256k1_ge_set_xo_var(elem, &x, pub[0] == SECP256K1_TAG_PUBKEY_ODD);
    } else if (size == 65 && (pub[0] == SECP256K1_TAG_PUBKEY_UNCOMPRESSED || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
        secp256k1_fe x, y;
        if (!secp256k1_fe_set_b32_limit(&x, pub+1) || !secp256k1_fe_set_b32_limit(&y, pub+33)) {
            return 0;
        }
        secp256k1_ge_set_xy(elem, &x, &y);
        if ((pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD) &&
            secp256k1_fe_is_odd(&y) != (pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
            return 0;
        }
        return secp256k1_ge_is_valid_var(elem);
    } else {
        return 0;
    }
}